

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::ParseFromArray
          (PerfEventConfig_CallstackSampling *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false> _Var2;
  bool bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  uint8_t cur_byte_2;
  ulong uVar10;
  uint8_t cur_byte_3;
  ulong *puVar11;
  uint8_t cur_byte;
  ulong uVar12;
  uint8_t cur_byte_1;
  ulong *puVar13;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_0023464c_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_0023464c_caseD_3;
        uVar6 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar8 >> 3;
    if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_0023464c_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar10 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar9 <= puVar13) ||
           (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
        goto switchD_0023464c_caseD_3;
      }
      local_40.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar9 < puVar13) goto switchD_0023464c_caseD_3;
      uVar10 = *puVar11;
      local_40.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar10 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                      uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar9 <= puVar13) goto switchD_0023464c_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar3 = 0x38 < uVar10;
        uVar10 = uVar10 + 7;
        if (bVar3) goto switchD_0023464c_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
        local_40.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar10 = (ulong)puVar11 & 0xffffffff;
        goto LAB_00234727;
      }
    default:
      goto switchD_0023464c_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar9 < puVar13) goto switchD_0023464c_caseD_3;
      uVar10 = (ulong)(uint)*puVar11;
      local_40.int_value_ = 0;
    }
    uVar12 = 0;
LAB_00234727:
    raw = puVar13;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
  local_40.int_value_ = local_40.int_value_ | uVar10 & 0xffffffff;
  uVar10 = uVar6 << 0x20 | uVar12;
  uVar8 = uVar10 | (ulong)((uint)uVar8 & 7) << 0x30;
  local_40.size_ = (uint32_t)uVar12;
  local_40.type_ = (uint8_t)(uVar8 >> 0x30);
  local_40.id_ = (uint16_t)(uVar10 >> 0x20);
  sVar4 = (short)uVar6;
  while (sVar4 != 0) {
    if ((ushort)uVar6 < 4) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
    }
    if ((ushort)uVar6 == 3) {
      this->user_frames_ = (PerfEventConfig_UnwindMode)local_40.int_value_;
    }
    else {
      uVar5 = (uint)uVar6 & 0xffff;
      if (uVar5 == 2) {
        this->kernel_frames_ = local_40.int_value_ != 0;
      }
      else if (uVar5 == 1) {
        _Var2._M_head_impl =
             (this->scope_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::PerfEventConfig_Scope,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
             .super__Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false>.
             _M_head_impl;
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                  (_Var2._M_head_impl,local_40.int_value_,uVar8 & 0xffffffff);
      }
      else {
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_40,&this->unknown_fields_);
      }
    }
    do {
      if (puVar9 <= raw) goto switchD_0023464c_caseD_3;
      bVar1 = (byte)*raw;
      uVar8 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_0023464c_caseD_3;
          uVar6 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar6 < '\0');
      }
      uVar6 = uVar8 >> 3;
      if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_0023464c_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar10 = 0;
        uVar12 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar9 <= puVar13) ||
             (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
          goto switchD_0023464c_caseD_3;
        }
        local_40.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 1:
        puVar13 = puVar11 + 1;
        if (puVar9 < puVar13) goto switchD_0023464c_caseD_3;
        uVar10 = *puVar11;
        local_40.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar12 = 0;
        uVar10 = 0;
        puVar13 = puVar11;
        while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                        uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar9 <= puVar13) goto switchD_0023464c_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar3 = 0x38 < uVar10;
          uVar10 = uVar10 + 7;
          if (bVar3) goto switchD_0023464c_caseD_3;
        }
        if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
          local_40.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar12);
          uVar10 = (ulong)puVar11 & 0xffffffff;
          goto LAB_002349da;
        }
      default:
        goto switchD_0023464c_caseD_3;
      case 5:
        puVar13 = (ulong *)((long)puVar11 + 4);
        if (puVar9 < puVar13) goto switchD_0023464c_caseD_3;
        uVar10 = (ulong)(uint)*puVar11;
        local_40.int_value_ = 0;
      }
      uVar12 = 0;
LAB_002349da:
      raw = puVar13;
    } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
    local_40.int_value_ = local_40.int_value_ | uVar10 & 0xffffffff;
    uVar10 = uVar6 << 0x20 | uVar12;
    uVar8 = uVar10 | (uVar8 & 7) << 0x30;
    local_40.size_ = (uint32_t)uVar12;
    local_40.type_ = (uint8_t)(uVar8 >> 0x30);
    local_40.id_ = (uint16_t)(uVar10 >> 0x20);
    sVar4 = (short)uVar6;
  }
switchD_0023464c_caseD_3:
  return puVar9 == (ulong *)raw;
}

Assistant:

bool PerfEventConfig_CallstackSampling::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* scope */:
        (*scope_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* kernel_frames */:
        field.get(&kernel_frames_);
        break;
      case 3 /* user_frames */:
        field.get(&user_frames_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}